

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O1

void av1_fadst4(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  av1_range_check_buf(0,input,input,4,*stage_range);
  iVar1 = *input;
  iVar2 = input[1];
  iVar3 = input[3];
  if (((iVar2 != 0 || iVar1 != 0) || input[2] != 0) || iVar3 != 0) {
    iVar5 = cos_bit + -10;
    iVar4 = av1_sinpi_arr_data[iVar5][3];
    iVar7 = av1_sinpi_arr_data[iVar5][4] * iVar3 + av1_sinpi_arr_data[iVar5][1] * iVar1 +
            av1_sinpi_arr_data[iVar5][2] * iVar2;
    iVar6 = av1_sinpi_arr_data[iVar5][2] * iVar3 +
            (av1_sinpi_arr_data[iVar5][4] * iVar1 - av1_sinpi_arr_data[iVar5][1] * iVar2);
    iVar5 = input[2] * iVar4;
    lVar8 = 1L << (cos_bit - 1U & 0x3f);
    *output = (int32_t)((iVar7 + iVar5) + lVar8 >> (cos_bit & 0x3fU));
    output[1] = (int32_t)(((iVar2 + iVar1) - iVar3) * iVar4 + lVar8 >> (cos_bit & 0x3fU));
    output[2] = (int32_t)((iVar6 - iVar5) + lVar8 >> (cos_bit & 0x3fU));
    output[3] = (int32_t)(((iVar6 + iVar5) - iVar7) + lVar8 >> (cos_bit & 0x3fU));
    av1_range_check_buf(6,input,output,4,stage_range[6]);
    return;
  }
  output[0] = 0;
  output[1] = 0;
  output[2] = 0;
  output[3] = 0;
  return;
}

Assistant:

void av1_fadst4(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  int bit = cos_bit;
  const int32_t *sinpi = sinpi_arr(bit);
  int32_t x0, x1, x2, x3;
  int32_t s0, s1, s2, s3, s4, s5, s6, s7;

  // stage 0
  av1_range_check_buf(0, input, input, 4, stage_range[0]);
  x0 = input[0];
  x1 = input[1];
  x2 = input[2];
  x3 = input[3];

  if (!(x0 | x1 | x2 | x3)) {
    output[0] = output[1] = output[2] = output[3] = 0;
    return;
  }

  // stage 1
  s0 = range_check_value(sinpi[1] * x0, bit + stage_range[1]);
  s1 = range_check_value(sinpi[4] * x0, bit + stage_range[1]);
  s2 = range_check_value(sinpi[2] * x1, bit + stage_range[1]);
  s3 = range_check_value(sinpi[1] * x1, bit + stage_range[1]);
  s4 = range_check_value(sinpi[3] * x2, bit + stage_range[1]);
  s5 = range_check_value(sinpi[4] * x3, bit + stage_range[1]);
  s6 = range_check_value(sinpi[2] * x3, bit + stage_range[1]);
  s7 = range_check_value(x0 + x1, stage_range[1]);

  // stage 2
  s7 = range_check_value(s7 - x3, stage_range[2]);

  // stage 3
  x0 = range_check_value(s0 + s2, bit + stage_range[3]);
  x1 = range_check_value(sinpi[3] * s7, bit + stage_range[3]);
  x2 = range_check_value(s1 - s3, bit + stage_range[3]);
  x3 = range_check_value(s4, bit + stage_range[3]);

  // stage 4
  x0 = range_check_value(x0 + s5, bit + stage_range[4]);
  x2 = range_check_value(x2 + s6, bit + stage_range[4]);

  // stage 5
  s0 = range_check_value(x0 + x3, bit + stage_range[5]);
  s1 = range_check_value(x1, bit + stage_range[5]);
  s2 = range_check_value(x2 - x3, bit + stage_range[5]);
  s3 = range_check_value(x2 - x0, bit + stage_range[5]);

  // stage 6
  s3 = range_check_value(s3 + x3, bit + stage_range[6]);

  // 1-D transform scaling factor is sqrt(2).
  output[0] = round_shift(s0, bit);
  output[1] = round_shift(s1, bit);
  output[2] = round_shift(s2, bit);
  output[3] = round_shift(s3, bit);
  av1_range_check_buf(6, input, output, 4, stage_range[6]);
}